

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_SetAllocatedAndReleaseTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_SetAllocatedAndReleaseTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  string *psVar4;
  Arena *arena;
  AssertHelper AVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar6;
  char *in_R9;
  pointer __p;
  char *pcVar7;
  pointer __p_1;
  pointer *__ptr;
  pointer *__ptr_1;
  size_t former_output_size;
  TestAllTypes message;
  internal local_340 [8];
  AssertHelperData *local_338;
  AssertHelper local_330;
  string local_328;
  AssertHelper local_308;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_300;
  AssertHelper local_2f8;
  AssertHelper local_2f0;
  AssertHelper local_2e8;
  undefined1 local_2e0 [528];
  ArenaStringPtr local_d0 [20];
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2e0,(Arena *)0x0);
  output = &(this->
            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_;
  local_340[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_338 = (AssertHelperData *)0x0;
  if ((bool)local_340[0]) {
    pcVar2 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    paVar1 = &local_328.field_2;
    local_328._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,pcVar2,
               pcVar2 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    local_340[0] = (internal)
                   ((AssertHelperData *)local_328._M_string_length == (AssertHelperData *)0x0);
    local_338 = (AssertHelperData *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p == paVar1) {
      if ((AssertHelperData *)local_328._M_string_length != (AssertHelperData *)0x0)
      goto LAB_008c1dcb;
    }
    else {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      if (((byte)local_340[0] & 1) == 0) {
LAB_008c1dcb:
        testing::Message::Message((Message *)&local_300);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,local_340,(AssertionResult *)"this->GetOutput().empty()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_330,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x497,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_300);
        testing::internal::AssertHelper::~AssertHelper(&local_330);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != paVar1) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_300._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_300._M_head_impl + 8))();
        }
      }
    }
    if (local_338 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
    }
    psVar4 = (string *)operator_new(0x20);
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar4,"test","");
    local_2e0._16_4_ = local_2e0._16_4_ | 2;
    local_300._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    arena = (Arena *)local_2e0._8_8_;
    if ((local_2e0._8_8_ & 1) != 0) {
      arena = *(Arena **)(local_2e0._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::SetAllocated(local_d0,psVar4,arena);
    local_340[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
    local_338 = (AssertHelperData *)0x0;
    if ((bool)local_340[0]) {
      local_2f0.data_._0_4_ = 4;
      pcVar2 = (this->
               super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).value_._M_dataplus._M_p;
      local_328._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,pcVar2,
                 pcVar2 + (this->
                          super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).value_._M_string_length);
      local_330.data_ = (AssertHelperData *)local_328._M_string_length;
      testing::internal::PredicateFormatterFromMatcher<testing::internal::GtMatcher<int>>::
      operator()(local_340,(char *)&local_2f0,(unsigned_long *)"this->GetOutput().size()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_340[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_328);
        if (local_338 == (AssertHelperData *)0x0) {
          pcVar7 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar7 = *(char **)local_338;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_330,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x49d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_328);
        testing::internal::AssertHelper::~AssertHelper(&local_330);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_328._M_dataplus._M_p + 8))();
        }
      }
      if (local_338 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338)
        ;
      }
      pcVar2 = (this->
               super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).value_._M_dataplus._M_p;
      local_328._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,pcVar2,
                 pcVar2 + (this->
                          super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).value_._M_string_length);
      sVar3 = local_328._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      local_330.data_ = (AssertHelperData *)sVar3;
      psVar4 = (string *)operator_new(0x20);
      (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
      pcVar7 = anon_var_dwarf_a22956 + 5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)psVar4,anon_var_dwarf_a22956 + 5,anon_var_dwarf_a22956 + 5);
      local_2e0._16_4_ = local_2e0._16_4_ | 1;
      local_2f0.data_ = (AssertHelperData *)0x0;
      if ((local_2e0._8_8_ & 1) != 0) {
        local_2e0._8_8_ = *(undefined8 *)(local_2e0._8_8_ & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::SetAllocated
                ((ArenaStringPtr *)(local_2e0 + 0x208),psVar4,(Arena *)local_2e0._8_8_);
      local_340[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
      local_338 = (AssertHelperData *)0x0;
      if ((bool)local_340[0]) {
        pcVar2 = (this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).value_._M_dataplus._M_p;
        local_328._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,pcVar2,
                   pcVar2 + (this->
                            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).value_._M_string_length);
        local_308.data_ = (AssertHelperData *)local_328._M_string_length;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_340,"former_output_size","this->GetOutput().size()",
                   (unsigned_long *)&local_330,(unsigned_long *)&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != paVar1) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if (local_340[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_328);
          if (local_338 != (AssertHelperData *)0x0) {
            pcVar7 = *(char **)local_338;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_308,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4a5,pcVar7);
          testing::internal::AssertHelper::operator=(&local_308,(Message *)&local_328);
          testing::internal::AssertHelper::~AssertHelper(&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_328._M_dataplus._M_p + 8))();
          }
        }
        if (local_338 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338);
        }
        if ((local_2e0._16_4_ & 2) == 0) {
          local_308.data_ = (AssertHelperData *)0x0;
        }
        else {
          local_2e0._16_4_ = local_2e0._16_4_ & 0xfffffffd;
          local_308.data_ =
               (AssertHelperData *)protobuf::internal::ArenaStringPtr::Release_abi_cxx11_(local_d0);
        }
        local_340[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_2e0,output);
        local_338 = (AssertHelperData *)0x0;
        if ((bool)local_340[0]) {
          pcVar2 = (this->
                   super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).value_._M_dataplus._M_p;
          local_328._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,pcVar2,
                     pcVar2 + (this->
                              super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).value_._M_string_length);
          local_340[0] = (internal)
                         ((AssertHelperData *)local_328._M_string_length == (AssertHelperData *)0x0)
          ;
          local_338 = (AssertHelperData *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p == paVar1) {
            if ((AssertHelperData *)local_328._M_string_length != (AssertHelperData *)0x0)
            goto LAB_008c23a6;
          }
          else {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
            if (((byte)local_340[0] & 1) == 0) {
LAB_008c23a6:
              testing::Message::Message((Message *)&local_2f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_328,local_340,(AssertionResult *)"this->GetOutput().empty()","false"
                         ,"true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_2e8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                         ,0x4aa,local_328._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2f8);
              goto LAB_008c2403;
            }
          }
        }
        else {
          testing::Message::Message((Message *)&local_2f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_328,local_340,(AssertionResult *)"TestSerialize(message, &output_sink)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4a8,local_328._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2f8);
LAB_008c2403:
          testing::internal::AssertHelper::~AssertHelper(&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar1) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if (local_2f8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2f8.data_ + 8))();
          }
        }
        if (local_338 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338);
        }
        if (local_308.data_ != (AssertHelperData *)0x0) {
          pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308;
          AVar5.data_ = local_308.data_;
LAB_008c2455:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              AVar5.data_);
        }
      }
      else {
        pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_338;
        testing::Message::Message((Message *)&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,local_340,(AssertionResult *)"TestSerialize(message, &output_sink)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4a3,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_308);
        testing::internal::AssertHelper::~AssertHelper(&local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != paVar1) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if (local_308.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_308.data_ + 8))();
        }
        AVar5.data_ = local_338;
        if (local_338 != (AssertHelperData *)0x0) goto LAB_008c2455;
      }
      if (local_2f0.data_ != (AssertHelperData *)0x0) {
        pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0;
        AVar5.data_ = local_2f0.data_;
LAB_008c2469:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            AVar5.data_);
      }
    }
    else {
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_338;
      testing::Message::Message((Message *)&local_330);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_328,local_340,(AssertionResult *)"TestSerialize(message, &output_sink)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x49b,local_328._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_330.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_330.data_ + 8))();
      }
      AVar5.data_ = local_338;
      if (local_338 != (AssertHelperData *)0x0) goto LAB_008c2469;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_008c2482;
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_300;
    __ptr_00._M_head_impl = local_300._M_head_impl;
  }
  else {
    testing::Message::Message((Message *)&local_300);
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_338;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_328,local_340,(AssertionResult *)"TestSerialize(message, &output_sink)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x496,local_328._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_300._M_head_impl + 8))();
    }
    __ptr_00._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
    if (local_338 == (AssertHelperData *)0x0) goto LAB_008c2482;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __ptr_00._M_head_impl);
LAB_008c2482:
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2e0);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, SetAllocatedAndReleaseTest) {
  // Check that setting an empty string via set_allocated_foo behaves properly;
  // Check that serializing after release_foo does not generate output for foo.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_TRUE(this->GetOutput().empty());

  auto allocated_bytes = std::make_unique<std::string>("test");
  message.set_allocated_optional_bytes(allocated_bytes.release());
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_THAT(this->GetOutput().size(),
              Gt(4));  // 4-byte-long string + tag/value + len

  size_t former_output_size = this->GetOutput().size();

  auto allocated_string = std::make_unique<std::string>("");
  message.set_allocated_optional_string(allocated_string.release());
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  // empty string not serialized.
  EXPECT_EQ(former_output_size, this->GetOutput().size());

  auto bytes_ptr = absl::WrapUnique(message.release_optional_bytes());
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_TRUE(
      this->GetOutput().empty());  // released fields are not serialized.
}